

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

void __thiscall
flatbuffers::ts::TsGenerator::GenEnum
          (TsGenerator *this,EnumDef *enum_def,string *code_ptr,import_set *imports,bool reverse)

{
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar2;
  reference ppEVar3;
  char *pcVar4;
  string local_238;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_218;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_210;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_88;
  EnumVal *local_80;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_70;
  const_iterator it;
  string local_58;
  string *local_38;
  string *code;
  import_set *piStack_28;
  bool reverse_local;
  import_set *imports_local;
  string *code_ptr_local;
  EnumDef *enum_def_local;
  TsGenerator *this_local;
  
  if ((((enum_def->super_Definition).generated & 1U) == 0) && (!reverse)) {
    local_38 = code_ptr;
    code._7_1_ = reverse;
    piStack_28 = imports;
    imports_local = (import_set *)code_ptr;
    code_ptr_local = (string *)enum_def;
    enum_def_local = (EnumDef *)this;
    GenDocComment(&(enum_def->super_Definition).doc_comment,code_ptr,(char *)0x0);
    std::__cxx11::string::operator+=((string *)local_38,"export enum ");
    GetTypeName_abi_cxx11_(&local_58,this,(EnumDef *)code_ptr_local,false,false);
    std::__cxx11::string::operator+=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::operator+=((string *)local_38," {\n");
    pvVar2 = EnumDef::Vals((EnumDef *)code_ptr_local);
    local_70._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2)
    ;
    while( true ) {
      pvVar2 = EnumDef::Vals((EnumDef *)code_ptr_local);
      ev = (EnumVal *)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar2)
      ;
      bVar1 = __gnu_cxx::operator!=
                        (&local_70,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev);
      if (!bVar1) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_70);
      local_80 = *ppEVar3;
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&local_80->doc_comment);
      if (!bVar1) {
        pvVar2 = EnumDef::Vals((EnumDef *)code_ptr_local);
        local_88._M_current =
             (EnumVal **)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                       (pvVar2);
        bVar1 = __gnu_cxx::operator!=(&local_70,&local_88);
        if (bVar1) {
          std::__cxx11::string::operator+=((string *)local_38,'\n');
        }
        GenDocComment(&local_80->doc_comment,(string *)imports_local,"  ");
      }
      if ((code._7_1_ & 1) == 0) {
        IdlNamer::Variant_abi_cxx11_(&local_188,&this->namer_,local_80);
        std::operator+(&local_168,"  ",&local_188);
        std::__cxx11::string::operator+=((string *)local_38,(string *)&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::operator+=((string *)local_38," = ");
        if (*(int *)&code_ptr_local[6].field_2 - 9U < 2) {
          EnumDef::ToString_abi_cxx11_(&local_1e8,(EnumDef *)code_ptr_local,local_80);
          std::operator+(&local_1c8,"\'",&local_1e8);
          std::operator+(&local_1a8,&local_1c8,"\'");
          std::__cxx11::string::operator+=((string *)local_38,(string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1e8);
        }
        else {
          EnumDef::ToString_abi_cxx11_(&local_208,(EnumDef *)code_ptr_local,local_80);
          std::__cxx11::string::operator+=((string *)local_38,(string *)&local_208);
          std::__cxx11::string::~string((string *)&local_208);
        }
      }
      else {
        EnumDef::ToString_abi_cxx11_(&local_e8,(EnumDef *)code_ptr_local,local_80);
        std::operator+(&local_c8,"  \'",&local_e8);
        std::operator+(&local_a8,&local_c8,"\'");
        std::__cxx11::string::operator+=((string *)local_38,(string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::operator+=((string *)local_38," = ");
        IdlNamer::Variant_abi_cxx11_(&local_148,&this->namer_,local_80);
        std::operator+(&local_128,"\'",&local_148);
        std::operator+(&local_108,&local_128,"\'");
        std::__cxx11::string::operator+=((string *)local_38,(string *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
      }
      local_210 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator+(&local_70,1);
      pvVar2 = EnumDef::Vals((EnumDef *)code_ptr_local);
      local_218._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar2)
      ;
      bVar1 = __gnu_cxx::operator!=(&local_210,&local_218);
      pcVar4 = "\n";
      if (bVar1) {
        pcVar4 = ",\n";
      }
      std::__cxx11::string::operator+=((string *)local_38,pcVar4);
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_70);
    }
    std::__cxx11::string::operator+=((string *)local_38,"}");
    if ((code_ptr_local[6]._M_string_length & 1) != 0) {
      GenUnionConvFunc(&local_238,this,(Type *)&code_ptr_local[6].field_2,piStack_28);
      std::__cxx11::string::operator+=((string *)local_38,(string *)&local_238);
      std::__cxx11::string::~string((string *)&local_238);
    }
    std::__cxx11::string::operator+=((string *)local_38,"\n");
  }
  return;
}

Assistant:

void GenEnum(EnumDef &enum_def, std::string *code_ptr, import_set &imports,
               bool reverse) {
    if (enum_def.generated) return;
    if (reverse) return;  // FIXME.
    std::string &code = *code_ptr;
    GenDocComment(enum_def.doc_comment, code_ptr);
    code += "export enum ";
    code += GetTypeName(enum_def);
    code += " {\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      if (!ev.doc_comment.empty()) {
        if (it != enum_def.Vals().begin()) { code += '\n'; }
        GenDocComment(ev.doc_comment, code_ptr, "  ");
      }

      // Generate mapping between EnumName: EnumValue(int)
      if (reverse) {
        code += "  '" + enum_def.ToString(ev) + "'";
        code += " = ";
        code += "'" + namer_.Variant(ev) + "'";
      } else {
        code += "  " + namer_.Variant(ev);
        code += " = ";
        // Unfortunately, because typescript does not support bigint enums,
        // for 64-bit enums, we instead map the enum names to strings.
        switch (enum_def.underlying_type.base_type) {
          case BASE_TYPE_LONG:
          case BASE_TYPE_ULONG: {
            code += "'" + enum_def.ToString(ev) + "'";
            break;
          }
          default: code += enum_def.ToString(ev);
        }
      }

      code += (it + 1) != enum_def.Vals().end() ? ",\n" : "\n";
    }
    code += "}";

    if (enum_def.is_union) {
      code += GenUnionConvFunc(enum_def.underlying_type, imports);
    }

    code += "\n";
  }